

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdCelsiusTexRect::is_valid_val(MthdCelsiusTexRect *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (((uVar1 >> 0x10 & 1) == 0) && (0xfffffffffffff800 < (ulong)(uVar1 & 0xffff) - 0x800)) {
    return uVar1 - 0x20000 < 0xffe0000;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 16, 1))
			return false;
		if (!extr(val, 0, 16) || extr(val, 0, 16) >= 0x800)
			return false;
		if (!extr(val, 17, 15) || extr(val, 17, 15) >= 0x800)
			return false;
		return true;
	}